

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

int duckdb::DecimalScaleDownCheckOperator::Operation<short,int>
              (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  short sVar7;
  long lVar8;
  undefined6 in_register_0000003a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  string error;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  lVar2 = *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)*(byte *)((long)dataptr + 0x25) * 8);
  lVar8 = (long)(int)CONCAT62(in_register_0000003a,input) % lVar2;
  lVar4 = -lVar8;
  if (-1 < input) {
    lVar4 = lVar8;
  }
  sVar7 = -input;
  if (0 < input) {
    sVar7 = input;
  }
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar5 = (short)lVar2;
  if (lVar4 < lVar2 / 2) {
    sVar5 = 0;
  }
  sVar1 = *(short *)((long)dataptr + 0x20);
  if (((short)(sVar5 + sVar7) < sVar1) &&
     (iVar3 = -(int)sVar1, iVar6 = (int)(short)(sVar5 + sVar7),
     iVar6 != iVar3 && SBORROW4(iVar6,iVar3) == iVar6 + sVar1 < 0)) {
    iVar3 = DecimalScaleDownOperator::Operation<short,int>(input,mask,idx,dataptr);
    return iVar3;
  }
  local_a8[0] = local_98;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Casting value \"%s\" to type %s failed: value is out of range!","")
  ;
  Decimal::ToString_abi_cxx11_
            (&local_68,(Decimal *)(ulong)(uint)(int)input,(ushort)*(byte *)((long)dataptr + 0x24),
             *(uint8_t *)((long)dataptr + 0x25),(uint8_t)params_1);
  LogicalType::ToString_abi_cxx11_(&local_88,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,(StringUtil *)local_a8,&local_68,&local_88,params_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  iVar3 = HandleVectorCastError::Operation<int>
                    (&local_48,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return iVar3;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = static_cast<DecimalScaleInput<INPUT_TYPE> *>(dataptr);
		if (!CanScaleDownDecimal(input, *data)) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return DecimalScaleDownOperator::Operation<INPUT_TYPE, RESULT_TYPE>(input, mask, idx, dataptr);
	}